

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void fadst8x8_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int iVar32;
  int iVar33;
  undefined1 auVar29 [16];
  int iVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar35;
  int iVar39;
  int iVar40;
  int iVar41;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar48;
  int iVar51;
  int iVar52;
  int iVar53;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar54;
  int iVar58;
  int iVar59;
  int iVar60;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar61;
  int iVar65;
  int iVar66;
  int iVar67;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  
  lVar16 = (long)bit * 0x100;
  uVar5 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x1e0);
  auVar23._4_4_ = uVar5;
  auVar23._0_4_ = uVar5;
  auVar23._8_4_ = uVar5;
  auVar23._12_4_ = uVar5;
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar16 + 0x170);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar16 + 0x1a0);
  iVar21 = -iVar7;
  uVar5 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x220);
  iVar17 = -iVar6;
  uVar8 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x250);
  iVar9 = *(int *)((long)vert_filter_length_chroma + lVar16 + 0x1b0);
  iVar18 = -iVar9;
  uVar10 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x210);
  uVar11 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x1d0);
  iVar12 = *(int *)((long)vert_filter_length_chroma + lVar16 + 0x1f0);
  iVar19 = -iVar12;
  uVar13 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x230);
  iVar20 = 1 << ((char)bit - 1U & 0x1f);
  uVar14 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 400);
  lVar16 = 0;
  uVar22 = 0;
  if (0 < col_num) {
    uVar22 = (ulong)(uint)col_num;
  }
  for (; uVar22 * 0x10 != lVar16; lVar16 = lVar16 + 0x10) {
    piVar1 = (int *)((long)*in + lVar16);
    piVar2 = (int *)((long)in[col_num * 7] + lVar16);
    auVar26 = pmulld(*(undefined1 (*) [16])((long)in[col_num * 3] + lVar16),auVar23);
    auVar29 = pmulld(*(undefined1 (*) [16])((long)in[col_num * 4] + lVar16),auVar23);
    auVar25 = ZEXT416((uint)bit);
    iVar48 = (iVar20 - auVar26._0_4_) + auVar29._0_4_ >> auVar25;
    iVar51 = (iVar20 - auVar26._4_4_) + auVar29._4_4_ >> auVar25;
    iVar52 = (iVar20 - auVar26._8_4_) + auVar29._8_4_ >> auVar25;
    iVar53 = (iVar20 - auVar26._12_4_) + auVar29._12_4_ >> auVar25;
    iVar61 = iVar20 - (auVar29._0_4_ + auVar26._0_4_) >> auVar25;
    iVar65 = iVar20 - (auVar29._4_4_ + auVar26._4_4_) >> auVar25;
    iVar66 = iVar20 - (auVar29._8_4_ + auVar26._8_4_) >> auVar25;
    iVar67 = iVar20 - (auVar29._12_4_ + auVar26._12_4_) >> auVar25;
    auVar29 = pmulld(*(undefined1 (*) [16])((long)in[col_num * 2] + lVar16),auVar23);
    auVar26 = pmulld(*(undefined1 (*) [16])((long)in[col_num * 5] + lVar16),auVar23);
    iVar71 = auVar29._0_4_ + iVar20;
    iVar76 = auVar29._4_4_ + iVar20;
    iVar79 = auVar29._8_4_ + iVar20;
    iVar82 = auVar29._12_4_ + iVar20;
    iVar28 = iVar71 - auVar26._0_4_ >> auVar25;
    iVar32 = iVar76 - auVar26._4_4_ >> auVar25;
    iVar33 = iVar79 - auVar26._8_4_ >> auVar25;
    iVar34 = iVar82 - auVar26._12_4_ >> auVar25;
    piVar3 = (int *)((long)in[col_num] + lVar16);
    iVar72 = iVar71 + auVar26._0_4_ >> auVar25;
    iVar77 = iVar76 + auVar26._4_4_ >> auVar25;
    iVar80 = iVar79 + auVar26._8_4_ >> auVar25;
    iVar83 = iVar82 + auVar26._12_4_ >> auVar25;
    piVar4 = (int *)((long)in[col_num * 6] + lVar16);
    iVar71 = iVar48 + *piVar1;
    iVar76 = iVar51 + piVar1[1];
    iVar79 = iVar52 + piVar1[2];
    iVar82 = iVar53 + piVar1[3];
    iVar35 = iVar61 - *piVar2;
    iVar39 = iVar65 - piVar2[1];
    iVar40 = iVar66 - piVar2[2];
    iVar41 = iVar67 - piVar2[3];
    iVar48 = *piVar1 - iVar48;
    iVar51 = piVar1[1] - iVar51;
    iVar52 = piVar1[2] - iVar52;
    iVar53 = piVar1[3] - iVar53;
    iVar61 = iVar61 + *piVar2;
    iVar65 = iVar65 + piVar2[1];
    iVar66 = iVar66 + piVar2[2];
    iVar67 = iVar67 + piVar2[3];
    auVar49._0_4_ = iVar28 - *piVar3;
    auVar49._4_4_ = iVar32 - piVar3[1];
    auVar49._8_4_ = iVar33 - piVar3[2];
    auVar49._12_4_ = iVar34 - piVar3[3];
    auVar42._0_4_ = iVar72 + *piVar4;
    auVar42._4_4_ = iVar77 + piVar4[1];
    auVar42._8_4_ = iVar80 + piVar4[2];
    auVar42._12_4_ = iVar83 + piVar4[3];
    auVar30._0_4_ = iVar28 + *piVar3;
    auVar30._4_4_ = iVar32 + piVar3[1];
    auVar30._8_4_ = iVar33 + piVar3[2];
    auVar30._12_4_ = iVar34 + piVar3[3];
    auVar37._4_4_ = iVar7;
    auVar37._0_4_ = iVar7;
    auVar37._8_4_ = iVar7;
    auVar37._12_4_ = iVar7;
    auVar29 = pmulld(auVar49,auVar37);
    auVar26._4_4_ = uVar5;
    auVar26._0_4_ = uVar5;
    auVar26._8_4_ = uVar5;
    auVar26._12_4_ = uVar5;
    auVar26 = pmulld(auVar42,auVar26);
    iVar54 = auVar29._0_4_ + iVar20 + auVar26._0_4_ >> auVar25;
    iVar58 = auVar29._4_4_ + iVar20 + auVar26._4_4_ >> auVar25;
    iVar59 = auVar29._8_4_ + iVar20 + auVar26._8_4_ >> auVar25;
    iVar60 = auVar29._12_4_ + iVar20 + auVar26._12_4_ >> auVar25;
    auVar45._0_4_ = *piVar4 - iVar72;
    auVar45._4_4_ = piVar4[1] - iVar77;
    auVar45._8_4_ = piVar4[2] - iVar80;
    auVar45._12_4_ = piVar4[3] - iVar83;
    auVar29._4_4_ = uVar5;
    auVar29._0_4_ = uVar5;
    auVar29._8_4_ = uVar5;
    auVar29._12_4_ = uVar5;
    auVar29 = pmulld(auVar49,auVar29);
    auVar70._4_4_ = iVar21;
    auVar70._0_4_ = iVar21;
    auVar70._8_4_ = iVar21;
    auVar70._12_4_ = iVar21;
    auVar26 = pmulld(auVar42,auVar70);
    iVar72 = auVar29._0_4_ + iVar20 + auVar26._0_4_ >> auVar25;
    iVar77 = auVar29._4_4_ + iVar20 + auVar26._4_4_ >> auVar25;
    iVar80 = auVar29._8_4_ + iVar20 + auVar26._8_4_ >> auVar25;
    iVar83 = auVar29._12_4_ + iVar20 + auVar26._12_4_ >> auVar25;
    auVar29 = pmulld(auVar37,auVar30);
    auVar68._4_4_ = uVar5;
    auVar68._0_4_ = uVar5;
    auVar68._8_4_ = uVar5;
    auVar68._12_4_ = uVar5;
    auVar26 = pmulld(auVar30,auVar68);
    auVar68 = pmulld(auVar45,auVar37);
    iVar28 = auVar26._0_4_ + iVar20 + auVar68._0_4_ >> auVar25;
    iVar32 = auVar26._4_4_ + iVar20 + auVar68._4_4_ >> auVar25;
    iVar33 = auVar26._8_4_ + iVar20 + auVar68._8_4_ >> auVar25;
    iVar34 = auVar26._12_4_ + iVar20 + auVar68._12_4_ >> auVar25;
    auVar31._4_4_ = uVar5;
    auVar31._0_4_ = uVar5;
    auVar31._8_4_ = uVar5;
    auVar31._12_4_ = uVar5;
    auVar26 = pmulld(auVar45,auVar31);
    iVar73 = (iVar20 - auVar29._0_4_) + auVar26._0_4_ >> auVar25;
    iVar78 = (iVar20 - auVar29._4_4_) + auVar26._4_4_ >> auVar25;
    iVar81 = (iVar20 - auVar29._8_4_) + auVar26._8_4_ >> auVar25;
    iVar84 = (iVar20 - auVar29._12_4_) + auVar26._12_4_ >> auVar25;
    auVar43._0_4_ = iVar54 + iVar71;
    auVar43._4_4_ = iVar58 + iVar76;
    auVar43._8_4_ = iVar59 + iVar79;
    auVar43._12_4_ = iVar60 + iVar82;
    auVar69._0_4_ = iVar72 + iVar35;
    auVar69._4_4_ = iVar77 + iVar39;
    auVar69._8_4_ = iVar80 + iVar40;
    auVar69._12_4_ = iVar83 + iVar41;
    auVar27._0_4_ = iVar71 - iVar54;
    auVar27._4_4_ = iVar76 - iVar58;
    auVar27._8_4_ = iVar79 - iVar59;
    auVar27._12_4_ = iVar82 - iVar60;
    auVar46._0_4_ = iVar28 + iVar48;
    auVar46._4_4_ = iVar32 + iVar51;
    auVar46._8_4_ = iVar33 + iVar52;
    auVar46._12_4_ = iVar34 + iVar53;
    auVar36._0_4_ = iVar35 - iVar72;
    auVar36._4_4_ = iVar39 - iVar77;
    auVar36._8_4_ = iVar40 - iVar80;
    auVar36._12_4_ = iVar41 - iVar83;
    auVar55._0_4_ = iVar73 - iVar61;
    auVar55._4_4_ = iVar78 - iVar65;
    auVar55._8_4_ = iVar81 - iVar66;
    auVar55._12_4_ = iVar84 - iVar67;
    auVar24._0_4_ = iVar48 - iVar28;
    auVar24._4_4_ = iVar51 - iVar32;
    auVar24._8_4_ = iVar52 - iVar33;
    auVar24._12_4_ = iVar53 - iVar34;
    auVar74._0_4_ = iVar73 + iVar61;
    auVar74._4_4_ = iVar78 + iVar65;
    auVar74._8_4_ = iVar81 + iVar66;
    auVar74._12_4_ = iVar84 + iVar67;
    auVar50._4_4_ = iVar6;
    auVar50._0_4_ = iVar6;
    auVar50._8_4_ = iVar6;
    auVar50._12_4_ = iVar6;
    auVar50 = pmulld(auVar43,auVar50);
    auVar44._4_4_ = uVar8;
    auVar44._0_4_ = uVar8;
    auVar44._8_4_ = uVar8;
    auVar44._12_4_ = uVar8;
    auVar68 = pmulld(auVar69,auVar44);
    auVar44 = pmulld(auVar43,auVar44);
    auVar63._4_4_ = iVar17;
    auVar63._0_4_ = iVar17;
    auVar63._8_4_ = iVar17;
    auVar63._12_4_ = iVar17;
    auVar70 = pmulld(auVar69,auVar63);
    auVar62._4_4_ = iVar9;
    auVar62._0_4_ = iVar9;
    auVar62._8_4_ = iVar9;
    auVar62._12_4_ = iVar9;
    auVar31 = pmulld(auVar46,auVar62);
    auVar47._4_4_ = uVar10;
    auVar47._0_4_ = uVar10;
    auVar47._8_4_ = uVar10;
    auVar47._12_4_ = uVar10;
    auVar62 = pmulld(auVar55,auVar47);
    auVar47 = pmulld(auVar46,auVar47);
    auVar56._4_4_ = iVar18;
    auVar56._0_4_ = iVar18;
    auVar56._8_4_ = iVar18;
    auVar56._12_4_ = iVar18;
    auVar56 = pmulld(auVar55,auVar56);
    auVar57._4_4_ = iVar12;
    auVar57._0_4_ = iVar12;
    auVar57._8_4_ = iVar12;
    auVar57._12_4_ = iVar12;
    auVar57 = pmulld(auVar27,auVar57);
    auVar64._4_4_ = uVar11;
    auVar64._0_4_ = uVar11;
    auVar64._8_4_ = uVar11;
    auVar64._12_4_ = uVar11;
    auVar63 = pmulld(auVar36,auVar64);
    auVar29 = pmulld(auVar27,auVar64);
    auVar38._4_4_ = iVar19;
    auVar38._0_4_ = iVar19;
    auVar38._8_4_ = iVar19;
    auVar38._12_4_ = iVar19;
    auVar37 = pmulld(auVar36,auVar38);
    auVar15._4_4_ = uVar13;
    auVar15._0_4_ = uVar13;
    auVar15._8_4_ = uVar13;
    auVar15._12_4_ = uVar13;
    auVar38 = pmulld(auVar24,auVar15);
    auVar75._4_4_ = uVar14;
    auVar75._0_4_ = uVar14;
    auVar75._8_4_ = uVar14;
    auVar75._12_4_ = uVar14;
    auVar64 = pmulld(auVar75,auVar74);
    auVar26 = pmulld(auVar24,auVar75);
    auVar75 = pmulld(auVar74,auVar15);
    piVar1 = (int *)((long)*out + lVar16);
    *piVar1 = auVar44._0_4_ + iVar20 + auVar70._0_4_ >> auVar25;
    piVar1[1] = auVar44._4_4_ + iVar20 + auVar70._4_4_ >> auVar25;
    piVar1[2] = auVar44._8_4_ + iVar20 + auVar70._8_4_ >> auVar25;
    piVar1[3] = auVar44._12_4_ + iVar20 + auVar70._12_4_ >> auVar25;
    piVar1 = (int *)((long)out[col_num] + lVar16);
    *piVar1 = (auVar38._0_4_ + iVar20) - auVar64._0_4_ >> auVar25;
    piVar1[1] = (auVar38._4_4_ + iVar20) - auVar64._4_4_ >> auVar25;
    piVar1[2] = (auVar38._8_4_ + iVar20) - auVar64._8_4_ >> auVar25;
    piVar1[3] = (auVar38._12_4_ + iVar20) - auVar64._12_4_ >> auVar25;
    piVar1 = (int *)((long)out[col_num * 2] + lVar16);
    *piVar1 = auVar47._0_4_ + iVar20 + auVar56._0_4_ >> auVar25;
    piVar1[1] = auVar47._4_4_ + iVar20 + auVar56._4_4_ >> auVar25;
    piVar1[2] = auVar47._8_4_ + iVar20 + auVar56._8_4_ >> auVar25;
    piVar1[3] = auVar47._12_4_ + iVar20 + auVar56._12_4_ >> auVar25;
    piVar1 = (int *)((long)out[col_num * 3] + lVar16);
    *piVar1 = auVar57._0_4_ + iVar20 + auVar63._0_4_ >> auVar25;
    piVar1[1] = auVar57._4_4_ + iVar20 + auVar63._4_4_ >> auVar25;
    piVar1[2] = auVar57._8_4_ + iVar20 + auVar63._8_4_ >> auVar25;
    piVar1[3] = auVar57._12_4_ + iVar20 + auVar63._12_4_ >> auVar25;
    piVar1 = (int *)((long)out[col_num * 4] + lVar16);
    *piVar1 = auVar29._0_4_ + iVar20 + auVar37._0_4_ >> auVar25;
    piVar1[1] = auVar29._4_4_ + iVar20 + auVar37._4_4_ >> auVar25;
    piVar1[2] = auVar29._8_4_ + iVar20 + auVar37._8_4_ >> auVar25;
    piVar1[3] = auVar29._12_4_ + iVar20 + auVar37._12_4_ >> auVar25;
    piVar1 = (int *)((long)out[col_num * 5] + lVar16);
    *piVar1 = auVar31._0_4_ + iVar20 + auVar62._0_4_ >> auVar25;
    piVar1[1] = auVar31._4_4_ + iVar20 + auVar62._4_4_ >> auVar25;
    piVar1[2] = auVar31._8_4_ + iVar20 + auVar62._8_4_ >> auVar25;
    piVar1[3] = auVar31._12_4_ + iVar20 + auVar62._12_4_ >> auVar25;
    piVar1 = (int *)((long)out[col_num * 6] + lVar16);
    *piVar1 = auVar26._0_4_ + iVar20 + auVar75._0_4_ >> auVar25;
    piVar1[1] = auVar26._4_4_ + iVar20 + auVar75._4_4_ >> auVar25;
    piVar1[2] = auVar26._8_4_ + iVar20 + auVar75._8_4_ >> auVar25;
    piVar1[3] = auVar26._12_4_ + iVar20 + auVar75._12_4_ >> auVar25;
    piVar1 = (int *)((long)out[col_num * 7] + lVar16);
    *piVar1 = auVar50._0_4_ + iVar20 + auVar68._0_4_ >> auVar25;
    piVar1[1] = auVar50._4_4_ + iVar20 + auVar68._4_4_ >> auVar25;
    piVar1[2] = auVar50._8_4_ + iVar20 + auVar68._8_4_ >> auVar25;
    piVar1[3] = auVar50._12_4_ + iVar20 + auVar68._12_4_ >> auVar25;
  }
  return;
}

Assistant:

static void fadst8x8_sse4_1(__m128i *in, __m128i *out, int bit,
                            const int col_num) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i zero = _mm_setzero_si128();
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;
  __m128i x, y;
  int col;

  // Note:
  //  Even column: 0, 2, ..., 14
  //  Odd column: 1, 3, ..., 15
  //  one even column plus one odd column constructs one row (8 coeffs)
  //  total we have 8 rows (8x8).
  for (col = 0; col < col_num; ++col) {
    // stage 0
    // stage 1
    u0 = in[col_num * 0 + col];
    u1 = _mm_sub_epi32(zero, in[col_num * 7 + col]);
    u2 = _mm_sub_epi32(zero, in[col_num * 3 + col]);
    u3 = in[col_num * 4 + col];
    u4 = _mm_sub_epi32(zero, in[col_num * 1 + col]);
    u5 = in[col_num * 6 + col];
    u6 = in[col_num * 2 + col];
    u7 = _mm_sub_epi32(zero, in[col_num * 5 + col]);

    // stage 2
    v0 = u0;
    v1 = u1;

    x = _mm_mullo_epi32(u2, cospi32);
    y = _mm_mullo_epi32(u3, cospi32);
    v2 = _mm_add_epi32(x, y);
    v2 = _mm_add_epi32(v2, rnding);
    v2 = _mm_srai_epi32(v2, bit);

    v3 = _mm_sub_epi32(x, y);
    v3 = _mm_add_epi32(v3, rnding);
    v3 = _mm_srai_epi32(v3, bit);

    v4 = u4;
    v5 = u5;

    x = _mm_mullo_epi32(u6, cospi32);
    y = _mm_mullo_epi32(u7, cospi32);
    v6 = _mm_add_epi32(x, y);
    v6 = _mm_add_epi32(v6, rnding);
    v6 = _mm_srai_epi32(v6, bit);

    v7 = _mm_sub_epi32(x, y);
    v7 = _mm_add_epi32(v7, rnding);
    v7 = _mm_srai_epi32(v7, bit);

    // stage 3
    u0 = _mm_add_epi32(v0, v2);
    u1 = _mm_add_epi32(v1, v3);
    u2 = _mm_sub_epi32(v0, v2);
    u3 = _mm_sub_epi32(v1, v3);
    u4 = _mm_add_epi32(v4, v6);
    u5 = _mm_add_epi32(v5, v7);
    u6 = _mm_sub_epi32(v4, v6);
    u7 = _mm_sub_epi32(v5, v7);

    // stage 4
    v0 = u0;
    v1 = u1;
    v2 = u2;
    v3 = u3;

    x = _mm_mullo_epi32(u4, cospi16);
    y = _mm_mullo_epi32(u5, cospi48);
    v4 = _mm_add_epi32(x, y);
    v4 = _mm_add_epi32(v4, rnding);
    v4 = _mm_srai_epi32(v4, bit);

    x = _mm_mullo_epi32(u4, cospi48);
    y = _mm_mullo_epi32(u5, cospim16);
    v5 = _mm_add_epi32(x, y);
    v5 = _mm_add_epi32(v5, rnding);
    v5 = _mm_srai_epi32(v5, bit);

    x = _mm_mullo_epi32(u6, cospim48);
    y = _mm_mullo_epi32(u7, cospi16);
    v6 = _mm_add_epi32(x, y);
    v6 = _mm_add_epi32(v6, rnding);
    v6 = _mm_srai_epi32(v6, bit);

    x = _mm_mullo_epi32(u6, cospi16);
    y = _mm_mullo_epi32(u7, cospi48);
    v7 = _mm_add_epi32(x, y);
    v7 = _mm_add_epi32(v7, rnding);
    v7 = _mm_srai_epi32(v7, bit);

    // stage 5
    u0 = _mm_add_epi32(v0, v4);
    u1 = _mm_add_epi32(v1, v5);
    u2 = _mm_add_epi32(v2, v6);
    u3 = _mm_add_epi32(v3, v7);
    u4 = _mm_sub_epi32(v0, v4);
    u5 = _mm_sub_epi32(v1, v5);
    u6 = _mm_sub_epi32(v2, v6);
    u7 = _mm_sub_epi32(v3, v7);

    // stage 6
    x = _mm_mullo_epi32(u0, cospi4);
    y = _mm_mullo_epi32(u1, cospi60);
    v0 = _mm_add_epi32(x, y);
    v0 = _mm_add_epi32(v0, rnding);
    v0 = _mm_srai_epi32(v0, bit);

    x = _mm_mullo_epi32(u0, cospi60);
    y = _mm_mullo_epi32(u1, cospim4);
    v1 = _mm_add_epi32(x, y);
    v1 = _mm_add_epi32(v1, rnding);
    v1 = _mm_srai_epi32(v1, bit);

    x = _mm_mullo_epi32(u2, cospi20);
    y = _mm_mullo_epi32(u3, cospi44);
    v2 = _mm_add_epi32(x, y);
    v2 = _mm_add_epi32(v2, rnding);
    v2 = _mm_srai_epi32(v2, bit);

    x = _mm_mullo_epi32(u2, cospi44);
    y = _mm_mullo_epi32(u3, cospim20);
    v3 = _mm_add_epi32(x, y);
    v3 = _mm_add_epi32(v3, rnding);
    v3 = _mm_srai_epi32(v3, bit);

    x = _mm_mullo_epi32(u4, cospi36);
    y = _mm_mullo_epi32(u5, cospi28);
    v4 = _mm_add_epi32(x, y);
    v4 = _mm_add_epi32(v4, rnding);
    v4 = _mm_srai_epi32(v4, bit);

    x = _mm_mullo_epi32(u4, cospi28);
    y = _mm_mullo_epi32(u5, cospim36);
    v5 = _mm_add_epi32(x, y);
    v5 = _mm_add_epi32(v5, rnding);
    v5 = _mm_srai_epi32(v5, bit);

    x = _mm_mullo_epi32(u6, cospi52);
    y = _mm_mullo_epi32(u7, cospi12);
    v6 = _mm_add_epi32(x, y);
    v6 = _mm_add_epi32(v6, rnding);
    v6 = _mm_srai_epi32(v6, bit);

    x = _mm_mullo_epi32(u6, cospi12);
    y = _mm_mullo_epi32(u7, cospim52);
    v7 = _mm_add_epi32(x, y);
    v7 = _mm_add_epi32(v7, rnding);
    v7 = _mm_srai_epi32(v7, bit);

    // stage 7
    out[col_num * 0 + col] = v1;
    out[col_num * 1 + col] = v6;
    out[col_num * 2 + col] = v3;
    out[col_num * 3 + col] = v4;
    out[col_num * 4 + col] = v5;
    out[col_num * 5 + col] = v2;
    out[col_num * 6 + col] = v7;
    out[col_num * 7 + col] = v0;
  }
}